

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS13NeuralNetworkFeatures(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  NeuralNetworkMultiArrayShapeMapping NVar3;
  NeuralNetworkImageShapeMapping NVar4;
  int iVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkRegressor *pNVar7;
  NeuralNetworkClassifier *pNVar8;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  NeuralNetworkLayer *layer_00;
  NeuralNetworkLayer *layer;
  int i;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers;
  Model *model_local;
  
  TVar2 = Specification::Model::Type_case(model);
  if (TVar2 == kNeuralNetworkRegressor) {
LAB_00386c03:
    pNVar7 = Specification::Model::neuralnetworkregressor(model);
    NVar3 = Specification::NeuralNetworkRegressor::arrayinputshapemapping(pNVar7);
    if (NVar3 != RANK5_ARRAY_MAPPING) {
      return true;
    }
    pNVar7 = Specification::Model::neuralnetworkregressor(model);
    NVar4 = Specification::NeuralNetworkRegressor::imageinputshapemapping(pNVar7);
    if (NVar4 != RANK5_IMAGE_MAPPING) {
      return true;
    }
  }
  else if (TVar2 != kNeuralNetworkClassifier) {
    if (TVar2 != kNeuralNetwork) goto LAB_00386c82;
    pNVar6 = Specification::Model::neuralnetwork(model);
    NVar3 = Specification::NeuralNetwork::arrayinputshapemapping(pNVar6);
    if (NVar3 != RANK5_ARRAY_MAPPING) {
      return true;
    }
    pNVar6 = Specification::Model::neuralnetwork(model);
    NVar4 = Specification::NeuralNetwork::imageinputshapemapping(pNVar6);
    if (NVar4 != RANK5_IMAGE_MAPPING) {
      return true;
    }
    goto LAB_00386c03;
  }
  pNVar8 = Specification::Model::neuralnetworkclassifier(model);
  NVar3 = Specification::NeuralNetworkClassifier::arrayinputshapemapping(pNVar8);
  if (NVar3 != RANK5_ARRAY_MAPPING) {
    return true;
  }
  pNVar8 = Specification::Model::neuralnetworkclassifier(model);
  NVar4 = Specification::NeuralNetworkClassifier::imageinputshapemapping(pNVar8);
  if (NVar4 != RANK5_IMAGE_MAPPING) {
    return true;
  }
LAB_00386c82:
  this = getNNSpec(model);
  if (this != (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)0x0) {
    for (layer._4_4_ = 0;
        iVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size
                          (this), layer._4_4_ < iVar5; layer._4_4_ = layer._4_4_ + 1) {
      layer_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                 operator[](this,layer._4_4_);
      bVar1 = isIOS12NeuralNetworkLayer(layer_00);
      if (!bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS13NeuralNetworkFeatures(const Specification::Model& model) {

    /* check if any of the messages in NeuralNetwork.proto, that were added in iOS version 13, are being used.
      If they are, return True, otherwise return False.

     In particular, check for the presence of the following messages:
     1. any new layer type, which was not in iOS 12.
     2. if the value of enums "NeuralNetworkMultiArrayShapeMapping" or "NeuralNetworkImageShapeMapping" is non 0
     */

    switch (model.Type_case()) {
        case Specification::Model::TypeCase::kNeuralNetwork:
            if (model.neuralnetwork().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetwork().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        case Specification::Model::TypeCase::kNeuralNetworkRegressor:
            if (model.neuralnetworkregressor().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetworkregressor().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        case Specification::Model::TypeCase::kNeuralNetworkClassifier:
            if (model.neuralnetworkclassifier().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetworkclassifier().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        default:
            break;
    }

    // check for new layers: by checking if its NOT one of the layers supported in iOS 12
    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if (!isIOS12NeuralNetworkLayer(layer)) {
                return true;
            }
        }
    }

    return false;
}